

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O0

kexinit_algorithm * ssh2_kexinit_addalg(kexinit_algorithm_list *list,char *name)

{
  kexinit_algorithm *pkVar1;
  ptrlen name_00;
  char *name_local;
  kexinit_algorithm_list *list_local;
  
  name_00 = ptrlen_from_asciz(name);
  pkVar1 = ssh2_kexinit_addalg_pl(list,name_00);
  return pkVar1;
}

Assistant:

static struct kexinit_algorithm *ssh2_kexinit_addalg(
    struct kexinit_algorithm_list *list, const char *name)
{
    return ssh2_kexinit_addalg_pl(list, ptrlen_from_asciz(name));
}